

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_context.h
# Opt level: O1

void __thiscall mocker::SemanticContext::SemanticContext(SemanticContext *this)

{
  this->state = Unused;
  SymTbl::SymTbl(&this->syms);
  (this->exprType)._M_h._M_buckets = &(this->exprType)._M_h._M_single_bucket;
  (this->exprType)._M_h._M_bucket_count = 1;
  (this->exprType)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->exprType)._M_h._M_element_count = 0;
  (this->exprType)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->exprType)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->exprType)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->leftValue)._M_h._M_buckets = &(this->leftValue)._M_h._M_single_bucket;
  (this->leftValue)._M_h._M_bucket_count = 1;
  (this->leftValue)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->leftValue)._M_h._M_element_count = 0;
  (this->leftValue)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->leftValue)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->leftValue)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->scopeIntroduced)._M_h._M_buckets = &(this->scopeIntroduced)._M_h._M_single_bucket;
  (this->scopeIntroduced)._M_h._M_bucket_count = 1;
  (this->scopeIntroduced)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->scopeIntroduced)._M_h._M_element_count = 0;
  (this->scopeIntroduced)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->scopeIntroduced)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->scopeIntroduced)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->scopeResiding)._M_h._M_buckets = &(this->scopeResiding)._M_h._M_single_bucket;
  (this->scopeResiding)._M_h._M_bucket_count = 1;
  (this->scopeResiding)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->scopeResiding)._M_h._M_element_count = 0;
  (this->scopeResiding)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->scopeResiding)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->scopeResiding)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->associatedDecl)._M_h._M_buckets = &(this->associatedDecl)._M_h._M_single_bucket;
  (this->associatedDecl)._M_h._M_bucket_count = 1;
  (this->associatedDecl)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->associatedDecl)._M_h._M_element_count = 0;
  (this->associatedDecl)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->associatedDecl)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->associatedDecl)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

SemanticContext() = default;